

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmInstructionType
anon_unknown.dwarf_20a43d::GetStoreInstruction(ExpressionContext *ctx,TypeBase *type)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  VmInstructionType VVar4;
  
  if (ctx->typeBool == type) {
    return VM_INST_STORE_BYTE;
  }
  if (ctx->typeChar == type) {
    return VM_INST_STORE_BYTE;
  }
  if (ctx->typeShort == type) {
    return VM_INST_STORE_SHORT;
  }
  if (ctx->typeInt == type) {
    return VM_INST_STORE_INT;
  }
  if (ctx->typeFloat == type) {
    return VM_INST_STORE_FLOAT;
  }
  if (ctx->typeDouble == type) {
    return VM_INST_STORE_DOUBLE;
  }
  if (ctx->typeLong == type) {
switchD_0025c337_caseD_12:
    VVar4 = VM_INST_STORE_LONG;
  }
  else {
    if (type == (TypeBase *)0x0) {
switchD_0025c337_caseD_13:
      bVar3 = false;
    }
    else {
      switch(type->typeID) {
      case 0x12:
        goto switchD_0025c337_caseD_12;
      default:
        goto switchD_0025c337_caseD_13;
      case 0x14:
        bVar3 = true;
        break;
      case 0x15:
        return VM_INST_STORE_STRUCT;
      case 0x19:
        return VM_INST_STORE_INT;
      }
    }
    VVar4 = VM_INST_STORE_STRUCT;
    if (bVar3) {
      return VM_INST_STORE_STRUCT;
    }
    if (ctx->typeAutoRef == (TypeStruct *)type) {
      return VM_INST_STORE_STRUCT;
    }
    if (ctx->typeAutoArray == (TypeStruct *)type) {
      return VM_INST_STORE_STRUCT;
    }
    if (type != (TypeBase *)0x0) {
      uVar1 = type->typeID;
      if (uVar1 - 9 < 2) {
        return VM_INST_STORE_INT;
      }
      if (uVar1 == 0xb) goto switchD_0025c337_caseD_12;
      if (uVar1 == 0x19) {
        return VM_INST_STORE_INT;
      }
    }
    uVar2 = type->size;
    if (uVar2 == 0) {
      __assert_fail("type->size != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x1ba,
                    "VmInstructionType (anonymous namespace)::GetStoreInstruction(ExpressionContext &, TypeBase *)"
                   );
    }
    if ((uVar2 & 3) != 0) {
      __assert_fail("type->size % 4 == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x1bb,
                    "VmInstructionType (anonymous namespace)::GetStoreInstruction(ExpressionContext &, TypeBase *)"
                   );
    }
    if (0xfffffff < (long)uVar2) {
      __assert_fail("type->size < NULLC_MAX_TYPE_SIZE",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x1bc,
                    "VmInstructionType (anonymous namespace)::GetStoreInstruction(ExpressionContext &, TypeBase *)"
                   );
    }
  }
  return VVar4;
}

Assistant:

VmInstructionType GetStoreInstruction(ExpressionContext &ctx, TypeBase *type)
	{
		if(type == ctx.typeBool || type == ctx.typeChar)
			return VM_INST_STORE_BYTE;

		if(type == ctx.typeShort)
			return VM_INST_STORE_SHORT;

		if(type == ctx.typeInt)
			return VM_INST_STORE_INT;

		if(type == ctx.typeFloat)
			return VM_INST_STORE_FLOAT;

		if(type == ctx.typeDouble)
			return VM_INST_STORE_DOUBLE;

		if(type == ctx.typeLong)
			return VM_INST_STORE_LONG;

		if(isType<TypeRef>(type))
			return VM_INST_STORE_POINTER;

		if(isType<TypeEnum>(type))
			return VM_INST_STORE_INT;

		if(isType<TypeFunction>(type) || isType<TypeUnsizedArray>(type) || type == ctx.typeAutoRef || type == ctx.typeAutoArray)
			return VM_INST_STORE_STRUCT;

		if(isType<TypeTypeID>(type) || isType<TypeFunctionID>(type) || isType<TypeEnum>(type))
			return VM_INST_STORE_INT;

		if(isType<TypeNullptr>(type))
			return VM_INST_STORE_POINTER;

		assert(type->size != 0);
		assert(type->size % 4 == 0);
		assert(type->size < NULLC_MAX_TYPE_SIZE);

		return VM_INST_STORE_STRUCT;
	}